

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  Rtree *pRtree;
  int iVar1;
  uint in_EAX;
  RtreeNode *pNode;
  i64 iVal;
  uint iCell;
  sqlite3_vtab *psVar2;
  RtreeCoord c;
  int rc;
  undefined8 local_38;
  
  if (*(char *)((long)&cur[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&cur[4].pVtab + 4) == 0) {
      psVar2 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar2 = cur[6].pVtab;
    }
  }
  else {
    psVar2 = (sqlite3_vtab *)(cur + 7);
  }
  pRtree = (Rtree *)cur->pVtab;
  local_38 = (ulong)in_EAX;
  pNode = rtreeNodeOfFirstSearchPoint((RtreeCursor *)cur,(int *)((long)&local_38 + 4));
  iVar1 = local_38._4_4_;
  if (psVar2 != (sqlite3_vtab *)0x0 && local_38._4_4_ == 0) {
    iCell = (uint)*(byte *)((long)&psVar2->zErrMsg + 2);
    if (i == 0) {
      iVal = nodeGetRowid(pRtree,pNode,iCell);
      sqlite3_result_int64(ctx,iVal);
    }
    else {
      readCoord(pNode->zData + (int)(pRtree->nBytesPerCell * iCell + i * 4 + 8),
                (RtreeCoord *)&local_38);
      if (pRtree->eCoordType == '\0') {
        sqlite3_result_double(ctx,(double)local_38._0_4_);
      }
      else {
        sqlite3_result_int(ctx,local_38._0_4_);
      }
    }
  }
  return iVar1;
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( p==0 ) return SQLITE_OK;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else{
    if( rc ) return rc;
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }
  return SQLITE_OK;
}